

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd<float,int,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean)

{
  double dVar1;
  
  if ((end - st) + 1 < 1000000) {
    calc_mean_and_sd_<float,int,double>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,x_sd,x_mean);
  }
  else {
    calc_mean_and_sd_<float,int,long_double>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,x_sd,x_mean);
  }
  dVar1 = *x_sd;
  if (dVar1 <= 1e-10) {
    dVar1 = 1e-10;
  }
  *x_sd = dVar1;
  return;
}

Assistant:

void calc_mean_and_sd(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    if (end - st + 1 < THRESHOLD_LONG_DOUBLE)
        calc_mean_and_sd_<real_t_, sparse_ix, double>(ix_arr, st, end, col_num, Xc, Xc_ind, Xc_indptr, x_sd, x_mean);
    else
        calc_mean_and_sd_<real_t_, sparse_ix, ldouble_safe>(ix_arr, st, end, col_num, Xc, Xc_ind, Xc_indptr, x_sd, x_mean);
    x_sd = std::fmax(SD_MIN, x_sd);
}